

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_format_specs<wchar_t> *pbVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  string groups;
  format_specs local_f8;
  string local_c8;
  ulong local_a8;
  ulong uStack_a0;
  wchar_t local_98 [2];
  wchar_t awStack_90 [6];
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_78;
  
  paVar1 = &local_c8.field_2;
  local_c8.field_2._M_allocated_capacity._0_2_ = 3;
  local_c8._M_string_length = 1;
  pbVar2 = this->specs;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  if (pbVar2->thousands == '\0') {
    on_dec(this);
  }
  else {
    local_78.f.abs_value = this->abs_value;
    lVar3 = 0x3f;
    if ((local_78.f.abs_value | 1) != 0) {
      for (; (local_78.f.abs_value | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar5 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    local_78.f.size =
         (uVar5 + 1) -
         (uint)(local_78.f.abs_value <
               *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar5 * 8));
    if (3 < (uint)local_78.f.size) {
      local_78.f.size = local_78.f.size + (local_78.f.size - 4U & 0xff) / 3 + 1;
    }
    local_78.prefix.size_ = (size_t)this->prefix_size;
    local_78.prefix.data_ = this->prefix;
    local_f8._32_8_ = *(undefined8 *)((pbVar2->fill).data_ + 5);
    local_f8.width = pbVar2->width;
    local_f8.precision = pbVar2->precision;
    uStack_a0._0_1_ = pbVar2->type;
    uStack_a0._1_3_ = *(undefined3 *)&pbVar2->field_0x9;
    uStack_a0._4_4_ = (pbVar2->fill).data_[0];
    local_f8.fill.data_._4_8_ = *(undefined8 *)((pbVar2->fill).data_ + 1);
    local_f8.fill.data_._12_8_ = *(undefined8 *)((pbVar2->fill).data_ + 3);
    local_78.size_ = (uint)local_78.f.size + local_78.prefix.size_;
    local_f8._9_1_ = SUB31(uStack_a0._1_3_,0);
    local_78.fill = uStack_a0._4_4_;
    local_f8._8_8_ = uStack_a0;
    if ((local_f8._9_1_ & 0xf) == 4) {
      uVar4 = local_f8._0_8_ & 0xffffffff;
      local_78.padding = 0;
      if (local_78.size_ <= uVar4) {
        local_78.padding = uVar4 - local_78.size_;
        local_78.size_ = uVar4;
      }
    }
    else {
      local_78.padding = 0;
      uVar5 = local_f8.precision - local_78.f.size;
      if (uVar5 != 0 && local_78.f.size <= (int)local_f8.precision) {
        local_78.fill = L'0';
      }
      if (uVar5 != 0 && local_78.f.size <= (int)local_f8.precision) {
        local_78.size_ = (uint)local_f8.precision + local_78.prefix.size_;
        local_78.padding = (ulong)uVar5;
      }
      if ((uStack_a0 & 0xf00) == 0) {
        local_f8._8_8_ = uStack_a0 | 0x200;
      }
    }
    local_78.f.groups = &local_c8;
    local_a8 = local_f8._0_8_;
    local_98 = (wchar_t  [2])local_f8.fill.data_._4_8_;
    awStack_90._0_8_ = local_f8.fill.data_._12_8_;
    awStack_90._8_8_ = local_f8._32_8_;
    local_78.f.sep = (int)pbVar2->thousands;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_f8,
               &local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }